

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O1

void RescalerImportRowExpand_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  byte *pbVar1;
  undefined1 (*pauVar2) [16];
  uint uVar3;
  rescaler_t *prVar4;
  short sVar5;
  short sVar6;
  ushort uVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [13];
  undefined1 auVar33 [13];
  undefined1 auVar34 [13];
  undefined1 auVar35 [13];
  undefined1 auVar36 [13];
  undefined1 auVar37 [13];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [13];
  undefined1 auVar49 [13];
  undefined1 auVar50 [13];
  unkuint9 Var51;
  undefined1 auVar52 [13];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [13];
  undefined1 auVar60 [13];
  undefined1 auVar61 [13];
  undefined1 auVar62 [13];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [13];
  undefined1 auVar66 [13];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  uint5 uVar71;
  uint uVar72;
  long lVar73;
  int iVar74;
  undefined1 (*pauVar75) [16];
  uint uVar76;
  ulong *puVar77;
  uint uVar78;
  uint uVar79;
  int iVar80;
  long lVar81;
  int iVar82;
  uint uVar83;
  rescaler_t *prVar84;
  ulong uVar85;
  undefined1 auVar86 [16];
  undefined1 uVar88;
  byte bVar89;
  undefined1 uVar90;
  undefined1 uVar91;
  undefined1 auVar87 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  
  auVar87 = _DAT_00151dc0;
  auVar86 = _DAT_00151db0;
  uVar3 = wrk->x_add;
  iVar74 = wrk->src_width;
  if (0x7fff < (int)uVar3 || (long)iVar74 < 8) {
    uVar3 = wrk->num_channels;
    lVar73 = (long)(int)uVar3;
    if (0 < lVar73) {
      iVar74 = wrk->dst_width * uVar3;
      prVar4 = wrk->frow;
      lVar81 = 0;
      uVar78 = uVar3;
      do {
        bVar89 = src[lVar81];
        uVar76 = (uint)bVar89;
        uVar79 = (uint)bVar89;
        if (1 < wrk->src_width) {
          uVar79 = (uint)src[lVar81 + lVar73];
        }
        iVar80 = wrk->x_add;
        prVar4[lVar81] = (bVar89 - uVar79) * iVar80 + wrk->x_add * uVar79;
        if ((int)(uVar3 + (int)lVar81) < iVar74) {
          prVar84 = prVar4 + uVar78;
          iVar82 = uVar3 + (int)lVar81;
          uVar83 = uVar78;
          do {
            iVar80 = iVar80 - wrk->x_sub;
            uVar72 = uVar79;
            if (iVar80 < 0) {
              iVar82 = iVar82 + uVar3;
              iVar80 = iVar80 + wrk->x_add;
              uVar72 = (uint)src[iVar82];
              uVar76 = uVar79;
            }
            uVar79 = uVar72;
            *prVar84 = (uVar76 - uVar79) * iVar80 + wrk->x_add * uVar79;
            prVar84 = prVar84 + lVar73;
            uVar83 = uVar83 + uVar3;
          } while ((int)uVar83 < iVar74);
        }
        lVar81 = lVar81 + 1;
        uVar78 = uVar78 + 1;
      } while (lVar81 != lVar73);
    }
    return;
  }
  pauVar75 = (undefined1 (*) [16])wrk->frow;
  pauVar2 = (undefined1 (*) [16])
            ((long)*pauVar75 + (long)wrk->dst_width * (long)wrk->num_channels * 4);
  if (wrk->num_channels == 4) {
    uVar85 = *(ulong *)src;
    uVar91 = (undefined1)(uVar85 >> 0x38);
    auVar8._8_6_ = 0;
    auVar8._0_8_ = uVar85;
    auVar8[0xe] = uVar91;
    uVar90 = (undefined1)(uVar85 >> 0x30);
    auVar12._8_4_ = 0;
    auVar12._0_8_ = uVar85;
    auVar12[0xc] = uVar90;
    auVar12._13_2_ = auVar8._13_2_;
    auVar16._8_4_ = 0;
    auVar16._0_8_ = uVar85;
    auVar16._12_3_ = auVar12._12_3_;
    bVar89 = (byte)(uVar85 >> 0x28);
    auVar20._8_2_ = 0;
    auVar20._0_8_ = uVar85;
    auVar20[10] = bVar89;
    auVar20._11_4_ = auVar16._11_4_;
    auVar24._8_2_ = 0;
    auVar24._0_8_ = uVar85;
    auVar24._10_5_ = auVar20._10_5_;
    auVar92[4] = (byte)(uVar85 >> 0x20);
    auVar28[8] = auVar92[4];
    auVar28._0_8_ = uVar85;
    auVar28._9_6_ = auVar24._9_6_;
    auVar42._7_8_ = 0;
    auVar42._0_7_ = auVar28._8_7_;
    uVar88 = (undefined1)(uVar85 >> 0x18);
    auVar43._8_7_ = 0;
    auVar43._0_8_ = SUB158(auVar42 << 0x40,7);
    auVar44._9_6_ = 0;
    auVar44._0_9_ = SUB159(auVar43 << 0x38,6);
    auVar45._10_5_ = 0;
    auVar45._0_10_ = SUB1510(auVar44 << 0x30,5);
    auVar46._11_4_ = 0;
    auVar46._0_11_ = SUB1511(auVar45 << 0x28,4);
    auVar47._12_3_ = 0;
    auVar47._0_12_ = SUB1512(auVar46 << 0x20,3);
    auVar40._13_2_ = 0;
    auVar40._0_13_ = SUB1513(auVar47 << 0x18,2);
    auVar40 = auVar40 << 0x10;
    auVar32[0xb] = 0;
    auVar32._0_11_ = auVar40._0_11_;
    auVar32[0xc] = uVar88;
    auVar33[10] = 0;
    auVar33._0_10_ = auVar40._0_10_;
    auVar33._11_2_ = auVar32._11_2_;
    auVar34[9] = 0;
    auVar34._0_9_ = auVar40._0_9_;
    auVar34._10_3_ = auVar33._10_3_;
    uVar71 = CONCAT41(auVar34._9_4_,(char)(uVar85 >> 0x10));
    auVar48._5_8_ = 0;
    auVar48._0_5_ = uVar71;
    auVar49._6_7_ = 0;
    auVar49._0_6_ = SUB136(auVar48 << 0x40,7);
    auVar50._7_6_ = 0;
    auVar50._0_7_ = SUB137(auVar49 << 0x38,6);
    Var51 = CONCAT81(SUB138(auVar50 << 0x30,5),(char)(uVar85 >> 8));
    auVar65._9_4_ = 0;
    auVar65._0_9_ = Var51;
    auVar52._10_3_ = 0;
    auVar52._0_10_ = SUB1310(auVar65 << 0x20,3);
    auVar94._0_2_ = (ushort)uVar85 & 0xff;
    auVar94._2_11_ = SUB1311(auVar52 << 0x18,2);
    auVar94._13_3_ = 0;
    auVar96._4_4_ = (int)Var51;
    auVar96._0_4_ = (int)uVar71;
    auVar96[8] = uVar88;
    auVar96._9_3_ = 0;
    auVar96[0xc] = uVar88;
    auVar96._13_3_ = 0;
    auVar92._1_3_ = 0;
    auVar92[0] = auVar92[4];
    auVar97._1_3_ = 0;
    auVar97[0] = bVar89;
    auVar97[4] = uVar90;
    auVar97._5_3_ = 0;
    auVar97[8] = uVar91;
    auVar97._9_3_ = 0;
    auVar97[0xc] = uVar91;
    auVar97._13_3_ = 0;
    auVar97 = auVar97 & _DAT_00151db0 | ~_DAT_00151db0 & auVar96;
    auVar92._5_3_ = 0;
    auVar92[8] = bVar89;
    auVar92._9_3_ = 0;
    auVar92[0xc] = uVar91;
    auVar92._13_3_ = 0;
    auVar100 = pshufhw(~_DAT_00151db0 & auVar96,auVar92,0xc4);
    auVar92 = pshuflw(auVar94,auVar94,0xec);
    auVar103._0_4_ = auVar92._0_4_;
    auVar103._12_4_ = auVar92._12_4_;
    auVar103._4_4_ = auVar103._12_4_;
    auVar103._8_4_ = auVar92._4_4_;
    auVar92 = auVar103 & _DAT_00151dc0 | ~_DAT_00151dc0 & auVar100;
    sVar5 = auVar92._0_2_;
    sVar6 = auVar92._2_2_;
    auVar100[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar92[2] - (0xff < sVar6);
    auVar100[0] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[0] - (0xff < sVar5);
    sVar5 = auVar92._4_2_;
    auVar100[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[4] - (0xff < sVar5);
    sVar5 = auVar92._6_2_;
    auVar100[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[6] - (0xff < sVar5);
    sVar5 = auVar92._8_2_;
    auVar100[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[8] - (0xff < sVar5);
    sVar5 = auVar92._10_2_;
    auVar100[5] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[10] - (0xff < sVar5);
    sVar5 = auVar92._12_2_;
    auVar100[6] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[0xc] - (0xff < sVar5);
    sVar5 = auVar92._14_2_;
    auVar100[7] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[0xe] - (0xff < sVar5);
    sVar5 = auVar97._0_2_;
    auVar100[8] = (0 < sVar5) * (sVar5 < 0x100) * auVar97[0] - (0xff < sVar5);
    sVar5 = auVar97._2_2_;
    auVar100[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar97[2] - (0xff < sVar5);
    uVar7 = auVar97._4_2_;
    auVar100[10] = (uVar7 != 0) * (uVar7 < 0x100) * auVar97[4] - (0xff < uVar7);
    auVar100[0xb] = 0;
    sVar5 = auVar97._8_2_;
    auVar100[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar97[8] - (0xff < sVar5);
    sVar5 = auVar97._10_2_;
    auVar100[0xd] = (0 < sVar5) * (sVar5 < 0x100) * auVar97[10] - (0xff < sVar5);
    sVar5 = auVar97._12_2_;
    auVar100[0xe] = (0 < sVar5) * (sVar5 < 0x100) * auVar97[0xc] - (0xff < sVar5);
    sVar5 = auVar97._14_2_;
    auVar100[0xf] = (0 < sVar5) * (sVar5 < 0x100) * auVar97[0xe] - (0xff < sVar5);
    puVar77 = (ulong *)(src + 4);
    uVar78 = uVar3;
    do {
      uVar79 = (uVar3 - uVar78) * 0x10000 | uVar78;
      auVar98._4_4_ = uVar79;
      auVar98._0_4_ = uVar79;
      auVar98._8_4_ = uVar79;
      auVar98._12_4_ = uVar79;
      auVar92 = pmaddwd(auVar98,auVar100);
      *pauVar75 = auVar92;
      pauVar75 = pauVar75 + 1;
      if ((pauVar75 < pauVar2) && (uVar78 = uVar78 - wrk->x_sub, (int)uVar78 < 0)) {
        uVar85 = *puVar77;
        uVar91 = (undefined1)(uVar85 >> 0x38);
        auVar9._8_6_ = 0;
        auVar9._0_8_ = uVar85;
        auVar9[0xe] = uVar91;
        uVar90 = (undefined1)(uVar85 >> 0x30);
        auVar13._8_4_ = 0;
        auVar13._0_8_ = uVar85;
        auVar13[0xc] = uVar90;
        auVar13._13_2_ = auVar9._13_2_;
        auVar17._8_4_ = 0;
        auVar17._0_8_ = uVar85;
        auVar17._12_3_ = auVar13._12_3_;
        bVar89 = (byte)(uVar85 >> 0x28);
        auVar21._8_2_ = 0;
        auVar21._0_8_ = uVar85;
        auVar21[10] = bVar89;
        auVar21._11_4_ = auVar17._11_4_;
        auVar25._8_2_ = 0;
        auVar25._0_8_ = uVar85;
        auVar25._10_5_ = auVar21._10_5_;
        auVar93[4] = (byte)(uVar85 >> 0x20);
        auVar29[8] = auVar93[4];
        auVar29._0_8_ = uVar85;
        auVar29._9_6_ = auVar25._9_6_;
        auVar53._7_8_ = 0;
        auVar53._0_7_ = auVar29._8_7_;
        uVar88 = (undefined1)(uVar85 >> 0x18);
        auVar54._8_7_ = 0;
        auVar54._0_8_ = SUB158(auVar53 << 0x40,7);
        auVar55._9_6_ = 0;
        auVar55._0_9_ = SUB159(auVar54 << 0x38,6);
        auVar56._10_5_ = 0;
        auVar56._0_10_ = SUB1510(auVar55 << 0x30,5);
        auVar57._11_4_ = 0;
        auVar57._0_11_ = SUB1511(auVar56 << 0x28,4);
        auVar58._12_3_ = 0;
        auVar58._0_12_ = SUB1512(auVar57 << 0x20,3);
        auVar41._13_2_ = 0;
        auVar41._0_13_ = SUB1513(auVar58 << 0x18,2);
        auVar41 = auVar41 << 0x10;
        auVar35[0xb] = 0;
        auVar35._0_11_ = auVar41._0_11_;
        auVar35[0xc] = uVar88;
        auVar36[10] = 0;
        auVar36._0_10_ = auVar41._0_10_;
        auVar36._11_2_ = auVar35._11_2_;
        auVar37[9] = 0;
        auVar37._0_9_ = auVar41._0_9_;
        auVar37._10_3_ = auVar36._10_3_;
        uVar71 = CONCAT41(auVar37._9_4_,(char)(uVar85 >> 0x10));
        auVar59._5_8_ = 0;
        auVar59._0_5_ = uVar71;
        auVar60._6_7_ = 0;
        auVar60._0_6_ = SUB136(auVar59 << 0x40,7);
        auVar61._7_6_ = 0;
        auVar61._0_7_ = SUB137(auVar60 << 0x38,6);
        Var51 = CONCAT81(SUB138(auVar61 << 0x30,5),(char)(uVar85 >> 8));
        auVar66._9_4_ = 0;
        auVar66._0_9_ = Var51;
        auVar62._10_3_ = 0;
        auVar62._0_10_ = SUB1310(auVar66 << 0x20,3);
        auVar99._0_2_ = (ushort)uVar85 & 0xff;
        auVar99._2_11_ = SUB1311(auVar62 << 0x18,2);
        auVar99._13_3_ = 0;
        auVar101._4_4_ = (int)Var51;
        auVar101._0_4_ = (int)uVar71;
        auVar101[8] = uVar88;
        auVar101._9_3_ = 0;
        auVar101[0xc] = uVar88;
        auVar101._13_3_ = 0;
        auVar93._1_3_ = 0;
        auVar93[0] = auVar93[4];
        auVar102._1_3_ = 0;
        auVar102[0] = bVar89;
        auVar102[4] = uVar90;
        auVar102._5_3_ = 0;
        auVar102[8] = uVar91;
        auVar102._9_3_ = 0;
        auVar102[0xc] = uVar91;
        auVar102._13_3_ = 0;
        auVar103 = auVar102 & auVar86 | ~auVar86 & auVar101;
        auVar93._5_3_ = 0;
        auVar93[8] = bVar89;
        auVar93._9_3_ = 0;
        auVar93[0xc] = uVar91;
        auVar93._13_3_ = 0;
        auVar92 = pshufhw(auVar93,auVar93,0xc4);
        auVar94 = pshuflw(auVar92,auVar99,0xec);
        auVar95._0_4_ = auVar94._0_4_;
        auVar95._12_4_ = auVar94._12_4_;
        auVar95._4_4_ = auVar95._12_4_;
        auVar95._8_4_ = auVar94._4_4_;
        auVar92 = auVar95 & auVar87 | ~auVar87 & auVar92;
        sVar5 = auVar92._0_2_;
        sVar6 = auVar92._2_2_;
        auVar100[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar92[2] - (0xff < sVar6);
        auVar100[0] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[0] - (0xff < sVar5);
        sVar5 = auVar92._4_2_;
        auVar100[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[4] - (0xff < sVar5);
        sVar5 = auVar92._6_2_;
        auVar100[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[6] - (0xff < sVar5);
        sVar5 = auVar92._8_2_;
        auVar100[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[8] - (0xff < sVar5);
        sVar5 = auVar92._10_2_;
        auVar100[5] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[10] - (0xff < sVar5);
        sVar5 = auVar92._12_2_;
        auVar100[6] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[0xc] - (0xff < sVar5);
        sVar5 = auVar92._14_2_;
        auVar100[7] = (0 < sVar5) * (sVar5 < 0x100) * auVar92[0xe] - (0xff < sVar5);
        sVar5 = auVar103._0_2_;
        auVar100[8] = (0 < sVar5) * (sVar5 < 0x100) * auVar103[0] - (0xff < sVar5);
        sVar5 = auVar103._2_2_;
        auVar100[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar103[2] - (0xff < sVar5);
        uVar7 = auVar103._4_2_;
        auVar100[10] = (uVar7 != 0) * (uVar7 < 0x100) * auVar103[4] - (0xff < uVar7);
        auVar100[0xb] = 0;
        sVar5 = auVar103._8_2_;
        auVar100[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar103[8] - (0xff < sVar5);
        sVar5 = auVar103._10_2_;
        auVar100[0xd] = (0 < sVar5) * (sVar5 < 0x100) * auVar103[10] - (0xff < sVar5);
        sVar5 = auVar103._12_2_;
        auVar100[0xe] = (0 < sVar5) * (sVar5 < 0x100) * auVar103[0xc] - (0xff < sVar5);
        sVar5 = auVar103._14_2_;
        auVar100[0xf] = (0 < sVar5) * (sVar5 < 0x100) * auVar103[0xe] - (0xff < sVar5);
        puVar77 = (ulong *)((long)puVar77 + 4);
        uVar78 = uVar78 + uVar3;
      }
    } while (pauVar75 < pauVar2);
  }
  else {
    uVar85 = *(ulong *)src;
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar85;
    auVar10[0xe] = (char)(uVar85 >> 0x38);
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar85;
    auVar14[0xc] = (char)(uVar85 >> 0x30);
    auVar14._13_2_ = auVar10._13_2_;
    auVar18._8_4_ = 0;
    auVar18._0_8_ = uVar85;
    auVar18._12_3_ = auVar14._12_3_;
    auVar22._8_2_ = 0;
    auVar22._0_8_ = uVar85;
    auVar22[10] = (char)(uVar85 >> 0x28);
    auVar22._11_4_ = auVar18._11_4_;
    auVar26._8_2_ = 0;
    auVar26._0_8_ = uVar85;
    auVar26._10_5_ = auVar22._10_5_;
    auVar30[8] = (char)(uVar85 >> 0x20);
    auVar30._0_8_ = uVar85;
    auVar30._9_6_ = auVar26._9_6_;
    auVar63._7_8_ = 0;
    auVar63._0_7_ = auVar30._8_7_;
    auVar67._1_8_ = SUB158(auVar63 << 0x40,7);
    auVar67[0] = (char)(uVar85 >> 0x18);
    auVar67._9_6_ = 0;
    auVar68._1_10_ = SUB1510(auVar67 << 0x30,5);
    auVar68[0] = (char)(uVar85 >> 0x10);
    auVar68._11_4_ = 0;
    auVar38[2] = (char)(uVar85 >> 8);
    auVar38._0_2_ = (ushort)uVar85;
    auVar38._3_12_ = SUB1512(auVar68 << 0x20,3);
    auVar86._0_2_ = (ushort)uVar85 & 0xff;
    auVar86._2_13_ = auVar38._2_13_;
    auVar86[0xf] = 0;
    puVar77 = (ulong *)(src + 7);
    iVar80 = 7;
    uVar78 = uVar3;
    do {
      auVar87 = pmaddwd(ZEXT416((uVar3 - uVar78) * 0x10000 | uVar78),auVar86);
      *(rescaler_t *)*pauVar75 = auVar87._0_4_;
      pauVar75 = (undefined1 (*) [16])((long)*pauVar75 + 4);
      if ((pauVar75 < pauVar2) && (uVar78 = uVar78 - wrk->x_sub, (int)uVar78 < 0)) {
        iVar80 = iVar80 + -1;
        if (iVar80 == 0) {
          if (src + (long)iVar74 + -8 < puVar77) {
            pbVar1 = (byte *)((long)puVar77 + 1);
            puVar77 = (ulong *)((long)puVar77 + 1);
            uVar85 = auVar86._2_8_;
            auVar86._8_8_ = auVar86._8_8_ >> 0x10;
            auVar86._0_8_ = uVar85 & 0xffffffff0000ffff | (ulong)*pbVar1 << 0x10;
            iVar80 = 1;
          }
          else {
            uVar85 = *puVar77;
            auVar11._8_6_ = 0;
            auVar11._0_8_ = uVar85;
            auVar11[0xe] = (char)(uVar85 >> 0x38);
            auVar15._8_4_ = 0;
            auVar15._0_8_ = uVar85;
            auVar15[0xc] = (char)(uVar85 >> 0x30);
            auVar15._13_2_ = auVar11._13_2_;
            auVar19._8_4_ = 0;
            auVar19._0_8_ = uVar85;
            auVar19._12_3_ = auVar15._12_3_;
            auVar23._8_2_ = 0;
            auVar23._0_8_ = uVar85;
            auVar23[10] = (char)(uVar85 >> 0x28);
            auVar23._11_4_ = auVar19._11_4_;
            auVar27._8_2_ = 0;
            auVar27._0_8_ = uVar85;
            auVar27._10_5_ = auVar23._10_5_;
            auVar31[8] = (char)(uVar85 >> 0x20);
            auVar31._0_8_ = uVar85;
            auVar31._9_6_ = auVar27._9_6_;
            auVar64._7_8_ = 0;
            auVar64._0_7_ = auVar31._8_7_;
            auVar69._1_8_ = SUB158(auVar64 << 0x40,7);
            auVar69[0] = (char)(uVar85 >> 0x18);
            auVar69._9_6_ = 0;
            auVar70._1_10_ = SUB1510(auVar69 << 0x30,5);
            auVar70[0] = (char)(uVar85 >> 0x10);
            auVar70._11_4_ = 0;
            auVar39[2] = (char)(uVar85 >> 8);
            auVar39._0_2_ = (ushort)uVar85;
            auVar39._3_12_ = SUB1512(auVar70 << 0x20,3);
            auVar86._0_2_ = (ushort)uVar85 & 0xff;
            auVar86._2_13_ = auVar39._2_13_;
            auVar86[0xf] = 0;
            puVar77 = (ulong *)((long)puVar77 + 7);
            iVar80 = 7;
          }
        }
        else {
          auVar86 = auVar86 >> 0x10;
        }
        uVar78 = uVar78 + uVar3;
      }
    } while (pauVar75 < pauVar2);
  }
  return;
}

Assistant:

static void RescalerImportRowExpand_SSE2(WebPRescaler* const wrk,
                                         const uint8_t* src) {
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = frow + wrk->dst_width * wrk->num_channels;
  const int x_add = wrk->x_add;
  int accum = x_add;
  __m128i cur_pixels;

  // SSE2 implementation only works with 16b signed arithmetic at max.
  if (wrk->src_width < 8 || accum >= (1 << 15)) {
    WebPRescalerImportRowExpand_C(wrk, src);
    return;
  }

  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  if (wrk->num_channels == 4) {
    LoadTwoPixels_SSE2(src, &cur_pixels);
    src += 4;
    while (1) {
      const __m128i mult = _mm_set1_epi32(((x_add - accum) << 16) | accum);
      const __m128i out = _mm_madd_epi16(cur_pixels, mult);
      _mm_storeu_si128((__m128i*)frow, out);
      frow += 4;
      if (frow >= frow_end) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        LoadTwoPixels_SSE2(src, &cur_pixels);
        src += 4;
        accum += x_add;
      }
    }
  } else {
    int left;
    const uint8_t* const src_limit = src + wrk->src_width - 8;
    LoadEightPixels_SSE2(src, &cur_pixels);
    src += 7;
    left = 7;
    while (1) {
      const __m128i mult = _mm_cvtsi32_si128(((x_add - accum) << 16) | accum);
      const __m128i out = _mm_madd_epi16(cur_pixels, mult);
      assert(sizeof(*frow) == sizeof(uint32_t));
      WebPUint32ToMem((uint8_t*)frow, _mm_cvtsi128_si32(out));
      frow += 1;
      if (frow >= frow_end) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        if (--left) {
          cur_pixels = _mm_srli_si128(cur_pixels, 2);
        } else if (src <= src_limit) {
          LoadEightPixels_SSE2(src, &cur_pixels);
          src += 7;
          left = 7;
        } else {   // tail
          cur_pixels = _mm_srli_si128(cur_pixels, 2);
          cur_pixels = _mm_insert_epi16(cur_pixels, src[1], 1);
          src += 1;
          left = 1;
        }
        accum += x_add;
      }
    }
  }
  assert(accum == 0);
}